

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerSettings.cpp
# Opt level: O1

void __thiscall I2sAnalyzerSettings::LoadSettings(I2sAnalyzerSettings *this,char *settings)

{
  char cVar1;
  int iVar2;
  SimpleArchive text_archive;
  PcmWordSelectInverted word_inverted;
  Sign sign;
  char *name_string;
  SimpleArchive aSStack_38 [8];
  PcmWordSelectInverted local_30;
  Sign local_2c;
  char *local_28;
  
  SimpleArchive::SimpleArchive(aSStack_38);
  SimpleArchive::SetString((char *)aSStack_38);
  SimpleArchive::operator>>(aSStack_38,&local_28);
  iVar2 = strcmp(local_28,"SaleaeI2sPcmAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              ("SaleaeI2sPcmAnalyzer: Provided with a settings string that doesn\'t belong to us;");
  }
  SimpleArchive::operator>>(aSStack_38,&this->mClockChannel);
  SimpleArchive::operator>>(aSStack_38,&this->mFrameChannel);
  SimpleArchive::operator>>(aSStack_38,&this->mDataChannel);
  SimpleArchive::operator>>(aSStack_38,&this->mShiftOrder);
  SimpleArchive::operator>>(aSStack_38,&this->mDataValidEdge);
  SimpleArchive::operator>>(aSStack_38,&this->mBitsPerWord);
  SimpleArchive::operator>>(aSStack_38,&this->mWordAlignment);
  SimpleArchive::operator>>(aSStack_38,&this->mFrameType);
  SimpleArchive::operator>>(aSStack_38,&this->mBitAlignment);
  cVar1 = SimpleArchive::operator>>(aSStack_38,&local_2c);
  if (cVar1 != '\0') {
    this->mSigned = local_2c;
  }
  cVar1 = SimpleArchive::operator>>(aSStack_38,&local_30);
  if (cVar1 != '\0') {
    this->mWordSelectInverted = local_30;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,false);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mFrameChannel,true);
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mDataChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(aSStack_38);
  return;
}

Assistant:

void I2sAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeI2sPcmAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeI2sPcmAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mClockChannel;
    text_archive >> mFrameChannel;
    text_archive >> mDataChannel;

    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> *( U32* )&mDataValidEdge;
    text_archive >> mBitsPerWord;

    text_archive >> *( U32* )&mWordAlignment;
    text_archive >> *( U32* )&mFrameType;
    text_archive >> *( U32* )&mBitAlignment;

    // check to make sure loading it actual works befor assigning the result -- do this when adding settings to an anylzer which has been
    // previously released.
    AnalyzerEnums::Sign sign;
    if( text_archive >> *( U32* )&sign )
        mSigned = sign;

    PcmWordSelectInverted word_inverted;
    if( text_archive >> *( U32* )&word_inverted )
        mWordSelectInverted = word_inverted;

    ClearChannels();
    AddChannel( mClockChannel, "PCM CLOCK", true );
    AddChannel( mFrameChannel, "PCM FRAME", true );
    AddChannel( mDataChannel, "PCM DATA", true );

    UpdateInterfacesFromSettings();
}